

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::SetMakefile(cmTarget *this,cmMakefile *mf)

{
  cmMakefile *pcVar1;
  bool bVar2;
  int iVar3;
  TargetType TVar4;
  char *pcVar5;
  reference pbVar6;
  cmTargetInternals *pcVar7;
  cmTargetInternals *pcVar8;
  const_iterator __first;
  const_iterator __last;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar9;
  iterator __first_00;
  iterator __last_00;
  cmStringRange cVar10;
  cmBacktraceRange cVar11;
  bool local_d8a;
  allocator local_d69;
  string local_d68;
  allocator local_d41;
  string local_d40;
  allocator local_d19;
  string local_d18;
  allocator local_cf1;
  string local_cf0;
  allocator local_cc9;
  string local_cc8;
  allocator local_ca1;
  string local_ca0;
  allocator local_c79;
  string local_c78;
  allocator local_c51;
  string local_c50;
  allocator local_c29;
  string local_c28;
  allocator local_c01;
  string local_c00;
  allocator local_bd9;
  string local_bd8;
  cmListFileBacktrace *local_bb8;
  cmListFileBacktrace *local_bb0;
  __normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
  local_ba8;
  __normal_iterator<cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
  local_ba0;
  const_iterator local_b98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b88;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b78;
  const_iterator local_b70;
  undefined1 local_b68 [8];
  cmBacktraceRange parentOptionsBts;
  cmStringRange parentOptions;
  undefined1 local_b38 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parentSystemIncludes;
  __normal_iterator<cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
  local_af0;
  const_iterator local_ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ad8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ad0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ac8;
  const_iterator local_ac0;
  undefined1 local_ab8 [8];
  cmBacktraceRange parentIncludesBts;
  cmStringRange parentIncludes;
  undefined1 local_a58 [8];
  string property_1;
  undefined1 local_a30 [8];
  string property;
  char **p;
  string configUpper;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9e0;
  iterator ci;
  char *configProps [7];
  string local_998;
  undefined1 local_978 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  string local_958;
  allocator local_931;
  string local_930;
  allocator local_909;
  string local_908;
  allocator local_8e1;
  string local_8e0;
  allocator local_8b9;
  string local_8b8;
  allocator local_891;
  string local_890;
  allocator local_869;
  string local_868;
  allocator local_841;
  string local_840;
  allocator local_819;
  string local_818;
  allocator local_7f1;
  string local_7f0;
  allocator local_7c9;
  string local_7c8;
  allocator local_7a1;
  string local_7a0;
  allocator local_779;
  string local_778;
  allocator local_751;
  string local_750;
  allocator local_729;
  string local_728;
  allocator local_701;
  string local_700;
  allocator local_6d9;
  string local_6d8;
  allocator local_6b1;
  string local_6b0;
  allocator local_689;
  string local_688;
  allocator local_661;
  string local_660;
  allocator local_639;
  string local_638;
  allocator local_611;
  string local_610;
  allocator local_5e9;
  string local_5e8;
  allocator local_5c1;
  string local_5c0;
  allocator local_599;
  string local_598;
  allocator local_571;
  string local_570;
  allocator local_549;
  string local_548;
  allocator local_521;
  string local_520;
  allocator local_4f9;
  string local_4f8;
  allocator local_4d1;
  string local_4d0;
  allocator local_4a9;
  string local_4a8;
  allocator local_481;
  string local_480;
  allocator local_459;
  string local_458;
  allocator local_431;
  string local_430;
  allocator local_409;
  string local_408;
  allocator local_3e1;
  string local_3e0;
  allocator local_3b9;
  string local_3b8;
  allocator local_391;
  string local_390;
  allocator local_369;
  string local_368;
  allocator local_341;
  string local_340;
  allocator local_319;
  string local_318;
  allocator local_2f1;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  allocator local_2a1;
  string local_2a0;
  allocator local_279;
  string local_278;
  allocator local_251;
  string local_250;
  allocator local_229;
  string local_228;
  allocator local_201;
  string local_200;
  allocator local_1d9;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  string local_188;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  byte local_9b;
  byte local_9a;
  allocator local_99;
  string local_98;
  byte local_73;
  byte local_72;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  cmMakefile *local_18;
  cmMakefile *mf_local;
  cmTarget *this_local;
  
  this->Makefile = mf;
  pcVar1 = this->Makefile;
  local_18 = mf;
  mf_local = (cmMakefile *)this;
  std::allocator<char>::allocator();
  local_72 = 0;
  local_73 = 0;
  local_9a = 0;
  local_9b = 0;
  std::__cxx11::string::string((string *)&local_38,"WIN32",&local_39);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_38);
  local_d8a = true;
  if (!bVar2) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    local_72 = 1;
    std::__cxx11::string::string((string *)&local_70,"CYGWIN",&local_71);
    local_73 = 1;
    bVar2 = cmMakefile::IsOn(pcVar1,&local_70);
    local_d8a = true;
    if (!bVar2) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      local_9a = 1;
      std::__cxx11::string::string((string *)&local_98,"MINGW",&local_99);
      local_9b = 1;
      local_d8a = cmMakefile::IsOn(pcVar1,&local_98);
    }
  }
  this->DLLPlatform = local_d8a;
  if ((local_9b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((local_9a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  if ((local_73 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((local_72 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"CMAKE_SYSTEM_NAME",&local_c1);
  pcVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_c0);
  iVar3 = strcmp(pcVar5,"Android");
  this->IsAndroid = iVar3 == 0;
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  TVar4 = GetType(this);
  if ((TVar4 != INTERFACE_LIBRARY) && (TVar4 = GetType(this), TVar4 != UTILITY)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e8,"ANDROID_API",&local_e9);
    SetPropertyDefault(this,&local_e8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_110,"ANDROID_API_MIN",&local_111);
    SetPropertyDefault(this,&local_110,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,"ANDROID_ARCH",&local_139);
    SetPropertyDefault(this,&local_138,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_160,"ANDROID_STL_TYPE",&local_161);
    SetPropertyDefault(this,&local_160,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_188,"ANDROID_SKIP_ANT_STEP",&local_189);
    SetPropertyDefault(this,&local_188,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b0,"ANDROID_PROCESS_MAX",&local_1b1);
    SetPropertyDefault(this,&local_1b0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d8,"ANDROID_PROGUARD",&local_1d9);
    SetPropertyDefault(this,&local_1d8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_200,"ANDROID_PROGUARD_CONFIG_PATH",&local_201);
    SetPropertyDefault(this,&local_200,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_228,"ANDROID_SECURE_PROPS_PATH",&local_229);
    SetPropertyDefault(this,&local_228,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_250,"ANDROID_NATIVE_LIB_DIRECTORIES",&local_251);
    SetPropertyDefault(this,&local_250,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_278,"ANDROID_NATIVE_LIB_DEPENDENCIES",&local_279);
    SetPropertyDefault(this,&local_278,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a0,"ANDROID_JAVA_SOURCE_DIR",&local_2a1);
    SetPropertyDefault(this,&local_2a0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2c8,"ANDROID_JAR_DIRECTORIES",&local_2c9);
    SetPropertyDefault(this,&local_2c8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f0,"ANDROID_JAR_DEPENDENCIES",&local_2f1);
    SetPropertyDefault(this,&local_2f0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_318,"ANDROID_ASSETS_DIRECTORIES",&local_319);
    SetPropertyDefault(this,&local_318,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_340,"ANDROID_ANT_ADDITIONAL_OPTIONS",&local_341);
    SetPropertyDefault(this,&local_340,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_340);
    std::allocator<char>::~allocator((allocator<char> *)&local_341);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_368,"INSTALL_NAME_DIR",&local_369);
    SetPropertyDefault(this,&local_368,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_390,"INSTALL_RPATH",&local_391);
    SetPropertyDefault(this,&local_390,"");
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3b8,"INSTALL_RPATH_USE_LINK_PATH",&local_3b9);
    SetPropertyDefault(this,&local_3b8,"OFF");
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3e0,"SKIP_BUILD_RPATH",&local_3e1);
    SetPropertyDefault(this,&local_3e0,"OFF");
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_408,"BUILD_WITH_INSTALL_RPATH",&local_409);
    SetPropertyDefault(this,&local_408,"OFF");
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_430,"ARCHIVE_OUTPUT_DIRECTORY",&local_431);
    SetPropertyDefault(this,&local_430,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_458,"LIBRARY_OUTPUT_DIRECTORY",&local_459);
    SetPropertyDefault(this,&local_458,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_480,"RUNTIME_OUTPUT_DIRECTORY",&local_481);
    SetPropertyDefault(this,&local_480,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator((allocator<char> *)&local_481);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4a8,"PDB_OUTPUT_DIRECTORY",&local_4a9);
    SetPropertyDefault(this,&local_4a8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4d0,"COMPILE_PDB_OUTPUT_DIRECTORY",&local_4d1);
    SetPropertyDefault(this,&local_4d0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4f8,"Fortran_FORMAT",&local_4f9);
    SetPropertyDefault(this,&local_4f8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_520,"Fortran_MODULE_DIRECTORY",&local_521);
    SetPropertyDefault(this,&local_520,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_520);
    std::allocator<char>::~allocator((allocator<char> *)&local_521);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_548,"GNUtoMS",&local_549);
    SetPropertyDefault(this,&local_548,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::~allocator((allocator<char> *)&local_549);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_570,"OSX_ARCHITECTURES",&local_571);
    SetPropertyDefault(this,&local_570,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_570);
    std::allocator<char>::~allocator((allocator<char> *)&local_571);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_598,"IOS_INSTALL_COMBINED",&local_599);
    SetPropertyDefault(this,&local_598,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_598);
    std::allocator<char>::~allocator((allocator<char> *)&local_599);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5c0,"AUTOMOC",&local_5c1);
    SetPropertyDefault(this,&local_5c0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5e8,"AUTOUIC",&local_5e9);
    SetPropertyDefault(this,&local_5e8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_5e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_610,"AUTORCC",&local_611);
    SetPropertyDefault(this,&local_610,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_610);
    std::allocator<char>::~allocator((allocator<char> *)&local_611);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_638,"AUTOMOC_MOC_OPTIONS",&local_639);
    SetPropertyDefault(this,&local_638,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_638);
    std::allocator<char>::~allocator((allocator<char> *)&local_639);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_660,"AUTOUIC_OPTIONS",&local_661);
    SetPropertyDefault(this,&local_660,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_660);
    std::allocator<char>::~allocator((allocator<char> *)&local_661);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_688,"AUTORCC_OPTIONS",&local_689);
    SetPropertyDefault(this,&local_688,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_688);
    std::allocator<char>::~allocator((allocator<char> *)&local_689);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6b0,"LINK_DEPENDS_NO_SHARED",&local_6b1);
    SetPropertyDefault(this,&local_6b0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6d8,"LINK_INTERFACE_LIBRARIES",&local_6d9);
    SetPropertyDefault(this,&local_6d8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_700,"WIN32_EXECUTABLE",&local_701);
    SetPropertyDefault(this,&local_700,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_700);
    std::allocator<char>::~allocator((allocator<char> *)&local_701);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_728,"MACOSX_BUNDLE",&local_729);
    SetPropertyDefault(this,&local_728,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_728);
    std::allocator<char>::~allocator((allocator<char> *)&local_729);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_750,"MACOSX_RPATH",&local_751);
    SetPropertyDefault(this,&local_750,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_750);
    std::allocator<char>::~allocator((allocator<char> *)&local_751);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_778,"NO_SYSTEM_FROM_IMPORTED",&local_779);
    SetPropertyDefault(this,&local_778,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_778);
    std::allocator<char>::~allocator((allocator<char> *)&local_779);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7a0,"C_COMPILER_LAUNCHER",&local_7a1);
    SetPropertyDefault(this,&local_7a0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_7a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7c8,"C_INCLUDE_WHAT_YOU_USE",&local_7c9);
    SetPropertyDefault(this,&local_7c8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_7c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7f0,"C_STANDARD",&local_7f1);
    SetPropertyDefault(this,&local_7f0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_818,"C_STANDARD_REQUIRED",&local_819);
    SetPropertyDefault(this,&local_818,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_818);
    std::allocator<char>::~allocator((allocator<char> *)&local_819);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_840,"C_EXTENSIONS",&local_841);
    SetPropertyDefault(this,&local_840,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_840);
    std::allocator<char>::~allocator((allocator<char> *)&local_841);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_868,"CXX_COMPILER_LAUNCHER",&local_869);
    SetPropertyDefault(this,&local_868,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_868);
    std::allocator<char>::~allocator((allocator<char> *)&local_869);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_890,"CXX_INCLUDE_WHAT_YOU_USE",&local_891);
    SetPropertyDefault(this,&local_890,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_890);
    std::allocator<char>::~allocator((allocator<char> *)&local_891);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8b8,"CXX_STANDARD",&local_8b9);
    SetPropertyDefault(this,&local_8b8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_8b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8e0,"CXX_STANDARD_REQUIRED",&local_8e1);
    SetPropertyDefault(this,&local_8e0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_8e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_908,"CXX_EXTENSIONS",&local_909);
    SetPropertyDefault(this,&local_908,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_908);
    std::allocator<char>::~allocator((allocator<char> *)&local_909);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_930,"LINK_SEARCH_START_STATIC",&local_931);
    SetPropertyDefault(this,&local_930,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_930);
    std::allocator<char>::~allocator((allocator<char> *)&local_931);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_958,"LINK_SEARCH_END_STATIC",
               (allocator *)
               ((long)&configNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    SetPropertyDefault(this,&local_958,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_958);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&configNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_978);
  cmMakefile::GetConfigurations
            (&local_998,local_18,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_978,true);
  std::__cxx11::string::~string((string *)&local_998);
  TVar4 = GetType(this);
  if (TVar4 != UTILITY) {
    memcpy(&ci,&PTR_anon_var_dwarf_15c12c_00a796f0,0x38);
    local_9e0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_978);
    while( true ) {
      configUpper.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_978);
      bVar2 = __gnu_cxx::operator!=
                        (&local_9e0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&configUpper.field_2 + 8));
      if (!bVar2) break;
      pbVar6 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_9e0);
      cmsys::SystemTools::UpperCase((string *)&p,pbVar6);
      for (property.field_2._8_8_ = &ci; *(long *)property.field_2._8_8_ != 0;
          property.field_2._8_8_ = property.field_2._8_8_ + 8) {
        if ((this->TargetTypeValue != INTERFACE_LIBRARY) ||
           (iVar3 = strcmp(*(char **)property.field_2._8_8_,"MAP_IMPORTED_CONFIG_"), iVar3 == 0)) {
          pcVar5 = *(char **)property.field_2._8_8_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_a30,pcVar5,(allocator *)(property_1.field_2._M_local_buf + 0xf)
                    );
          std::allocator<char>::~allocator
                    ((allocator<char> *)(property_1.field_2._M_local_buf + 0xf));
          std::__cxx11::string::operator+=((string *)local_a30,(string *)&p);
          SetPropertyDefault(this,(string *)local_a30,(char *)0x0);
          std::__cxx11::string::~string((string *)local_a30);
        }
      }
      if ((this->TargetTypeValue != EXECUTABLE) && (this->TargetTypeValue != INTERFACE_LIBRARY)) {
        pbVar6 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_9e0);
        cmsys::SystemTools::UpperCase((string *)local_a58,pbVar6);
        std::__cxx11::string::operator+=((string *)local_a58,"_POSTFIX");
        SetPropertyDefault(this,(string *)local_a58,(char *)0x0);
        std::__cxx11::string::~string((string *)local_a58);
      }
      std::__cxx11::string::~string((string *)&p);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_9e0);
    }
  }
  cmMakefile::GetBacktrace((cmListFileBacktrace *)&parentIncludes.End,this->Makefile);
  cmListFileBacktrace::operator=(&this->Backtrace,(cmListFileBacktrace *)&parentIncludes.End);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&parentIncludes.End);
  bVar2 = IsImported(this);
  if (!bVar2) {
    cVar10 = cmMakefile::GetIncludeDirectoriesEntries_abi_cxx11_(this->Makefile);
    parentIncludes.Begin = cVar10.End._M_current;
    parentIncludesBts.End._M_current = (cmListFileBacktrace *)cVar10.Begin._M_current;
    cVar11 = cmMakefile::GetIncludeDirectoriesBacktraces(this->Makefile);
    parentIncludesBts.Begin = cVar11.End._M_current;
    local_ab8 = (undefined1  [8])cVar11.Begin._M_current;
    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
    pcVar8 = cmTargetInternalPointer::operator->(&this->Internal);
    local_ac8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&pcVar8->IncludeDirectoriesEntries);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_ac0,&local_ac8);
    local_ad0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&parentIncludesBts.End);
    local_ad8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&parentIncludesBts.End);
    local_ae0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           pcVar7,local_ac0,local_ad0,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_ad8);
    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
    pcVar8 = cmTargetInternalPointer::operator->(&this->Internal);
    local_af0._M_current =
         (cmListFileBacktrace *)
         std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::end
                   (&pcVar8->IncludeDirectoriesBacktraces);
    __gnu_cxx::
    __normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
    ::__normal_iterator<cmListFileBacktrace*>
              ((__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
                *)&local_ae8,&local_af0);
    __first = cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
              ::begin((cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                       *)local_ab8);
    __last = cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
             ::end((cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                    *)local_ab8);
    parentSystemIncludes._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
                 insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>,void>
                           ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
                            &pcVar7->IncludeDirectoriesBacktraces,local_ae8,
                            (__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
                             )__first._M_current,
                            (__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
                             )__last._M_current);
    psVar9 = cmMakefile::GetSystemIncludeDirectories_abi_cxx11_(this->Makefile);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_b38,psVar9);
    __first_00 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_b38);
    __last_00 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_b38);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->SystemIncludeDirectories,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__first_00._M_node,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__last_00._M_node);
    cVar10 = cmMakefile::GetCompileOptionsEntries_abi_cxx11_(this->Makefile);
    parentOptionsBts.End._M_current = (cmListFileBacktrace *)cVar10.Begin._M_current;
    cVar11 = cmMakefile::GetCompileOptionsBacktraces(this->Makefile);
    parentOptionsBts.Begin = cVar11.End._M_current;
    local_b68 = (undefined1  [8])cVar11.Begin._M_current;
    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
    pcVar8 = cmTargetInternalPointer::operator->(&this->Internal);
    local_b78._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&pcVar8->CompileOptionsEntries);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_b70,&local_b78);
    local_b80._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&parentOptionsBts.End);
    local_b88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&parentOptionsBts.End);
    local_b90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &pcVar7->CompileOptionsEntries,local_b70,local_b80,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_b88);
    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
    pcVar8 = cmTargetInternalPointer::operator->(&this->Internal);
    local_ba0._M_current =
         (cmListFileBacktrace *)
         std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::end
                   (&pcVar8->CompileOptionsBacktraces);
    __gnu_cxx::
    __normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
    ::__normal_iterator<cmListFileBacktrace*>
              ((__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
                *)&local_b98,&local_ba0);
    local_ba8._M_current =
         (cmListFileBacktrace *)
         cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
         ::begin((cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                  *)local_b68);
    local_bb0 = (cmListFileBacktrace *)
                cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                ::end((cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                       *)local_b68);
    local_bb8 = (cmListFileBacktrace *)
                std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
                insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>,void>
                          ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
                           &pcVar7->CompileOptionsBacktraces,local_b98,local_ba8,
                           (__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
                            )local_bb0);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_b38);
  }
  TVar4 = GetType(this);
  if ((TVar4 != INTERFACE_LIBRARY) && (TVar4 = GetType(this), TVar4 != UTILITY)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_bd8,"C_VISIBILITY_PRESET",&local_bd9);
    SetPropertyDefault(this,&local_bd8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_bd8);
    std::allocator<char>::~allocator((allocator<char> *)&local_bd9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c00,"CXX_VISIBILITY_PRESET",&local_c01);
    SetPropertyDefault(this,&local_c00,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_c00);
    std::allocator<char>::~allocator((allocator<char> *)&local_c01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c28,"VISIBILITY_INLINES_HIDDEN",&local_c29);
    SetPropertyDefault(this,&local_c28,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_c28);
    std::allocator<char>::~allocator((allocator<char> *)&local_c29);
  }
  if (this->TargetTypeValue == EXECUTABLE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c50,"ANDROID_GUI",&local_c51);
    SetPropertyDefault(this,&local_c50,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_c50);
    std::allocator<char>::~allocator((allocator<char> *)&local_c51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c78,"CROSSCOMPILING_EMULATOR",&local_c79);
    SetPropertyDefault(this,&local_c78,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_c78);
    std::allocator<char>::~allocator((allocator<char> *)&local_c79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_ca0,"ENABLE_EXPORTS",&local_ca1);
    SetPropertyDefault(this,&local_ca0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_ca0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ca1);
  }
  if ((this->TargetTypeValue == SHARED_LIBRARY) || (this->TargetTypeValue == MODULE_LIBRARY)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_cc8,"POSITION_INDEPENDENT_CODE",&local_cc9);
    SetProperty(this,&local_cc8,"True");
    std::__cxx11::string::~string((string *)&local_cc8);
    std::allocator<char>::~allocator((allocator<char> *)&local_cc9);
  }
  if (this->TargetTypeValue == SHARED_LIBRARY) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_cf0,"WINDOWS_EXPORT_ALL_SYMBOLS",&local_cf1);
    SetPropertyDefault(this,&local_cf0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_cf0);
    std::allocator<char>::~allocator((allocator<char> *)&local_cf1);
  }
  TVar4 = GetType(this);
  if ((TVar4 != INTERFACE_LIBRARY) && (TVar4 = GetType(this), TVar4 != UTILITY)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d18,"POSITION_INDEPENDENT_CODE",&local_d19);
    SetPropertyDefault(this,&local_d18,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_d18);
    std::allocator<char>::~allocator((allocator<char> *)&local_d19);
  }
  cmMakefile::RecordPolicies(this->Makefile,&this->PolicyMap);
  if (this->TargetTypeValue == INTERFACE_LIBRARY) {
    cmPolicies::PolicyMap::Set(&this->PolicyMap,CMP0022,NEW);
  }
  TVar4 = GetType(this);
  if ((TVar4 != INTERFACE_LIBRARY) && (TVar4 = GetType(this), TVar4 != UTILITY)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d40,"JOB_POOL_COMPILE",&local_d41);
    SetPropertyDefault(this,&local_d40,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_d40);
    std::allocator<char>::~allocator((allocator<char> *)&local_d41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d68,"JOB_POOL_LINK",&local_d69);
    SetPropertyDefault(this,&local_d68,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_d68);
    std::allocator<char>::~allocator((allocator<char> *)&local_d69);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_978);
  return;
}

Assistant:

void cmTarget::SetMakefile(cmMakefile* mf)
{
  // Set our makefile.
  this->Makefile = mf;

  // Check whether this is a DLL platform.
  this->DLLPlatform = (this->Makefile->IsOn("WIN32") ||
                       this->Makefile->IsOn("CYGWIN") ||
                       this->Makefile->IsOn("MINGW"));

  // Check whether we are targeting an Android platform.
  this->IsAndroid =
    strcmp(this->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME"),
           "Android") == 0;

  // Setup default property values.
  if (this->GetType() != cmState::INTERFACE_LIBRARY
      && this->GetType() != cmState::UTILITY)
    {
    this->SetPropertyDefault("ANDROID_API", 0);
    this->SetPropertyDefault("ANDROID_API_MIN", 0);
    this->SetPropertyDefault("ANDROID_ARCH", 0);
    this->SetPropertyDefault("ANDROID_STL_TYPE", 0);
    this->SetPropertyDefault("ANDROID_SKIP_ANT_STEP", 0);
    this->SetPropertyDefault("ANDROID_PROCESS_MAX", 0);
    this->SetPropertyDefault("ANDROID_PROGUARD", 0);
    this->SetPropertyDefault("ANDROID_PROGUARD_CONFIG_PATH", 0);
    this->SetPropertyDefault("ANDROID_SECURE_PROPS_PATH", 0);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DIRECTORIES", 0);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DEPENDENCIES", 0);
    this->SetPropertyDefault("ANDROID_JAVA_SOURCE_DIR", 0);
    this->SetPropertyDefault("ANDROID_JAR_DIRECTORIES", 0);
    this->SetPropertyDefault("ANDROID_JAR_DEPENDENCIES", 0);
    this->SetPropertyDefault("ANDROID_ASSETS_DIRECTORIES", 0);
    this->SetPropertyDefault("ANDROID_ANT_ADDITIONAL_OPTIONS", 0);
    this->SetPropertyDefault("INSTALL_NAME_DIR", 0);
    this->SetPropertyDefault("INSTALL_RPATH", "");
    this->SetPropertyDefault("INSTALL_RPATH_USE_LINK_PATH", "OFF");
    this->SetPropertyDefault("SKIP_BUILD_RPATH", "OFF");
    this->SetPropertyDefault("BUILD_WITH_INSTALL_RPATH", "OFF");
    this->SetPropertyDefault("ARCHIVE_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("LIBRARY_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("RUNTIME_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("PDB_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("COMPILE_PDB_OUTPUT_DIRECTORY", 0);
    this->SetPropertyDefault("Fortran_FORMAT", 0);
    this->SetPropertyDefault("Fortran_MODULE_DIRECTORY", 0);
    this->SetPropertyDefault("GNUtoMS", 0);
    this->SetPropertyDefault("OSX_ARCHITECTURES", 0);
    this->SetPropertyDefault("IOS_INSTALL_COMBINED", 0);
    this->SetPropertyDefault("AUTOMOC", 0);
    this->SetPropertyDefault("AUTOUIC", 0);
    this->SetPropertyDefault("AUTORCC", 0);
    this->SetPropertyDefault("AUTOMOC_MOC_OPTIONS", 0);
    this->SetPropertyDefault("AUTOUIC_OPTIONS", 0);
    this->SetPropertyDefault("AUTORCC_OPTIONS", 0);
    this->SetPropertyDefault("LINK_DEPENDS_NO_SHARED", 0);
    this->SetPropertyDefault("LINK_INTERFACE_LIBRARIES", 0);
    this->SetPropertyDefault("WIN32_EXECUTABLE", 0);
    this->SetPropertyDefault("MACOSX_BUNDLE", 0);
    this->SetPropertyDefault("MACOSX_RPATH", 0);
    this->SetPropertyDefault("NO_SYSTEM_FROM_IMPORTED", 0);
    this->SetPropertyDefault("C_COMPILER_LAUNCHER", 0);
    this->SetPropertyDefault("C_INCLUDE_WHAT_YOU_USE", 0);
    this->SetPropertyDefault("C_STANDARD", 0);
    this->SetPropertyDefault("C_STANDARD_REQUIRED", 0);
    this->SetPropertyDefault("C_EXTENSIONS", 0);
    this->SetPropertyDefault("CXX_COMPILER_LAUNCHER", 0);
    this->SetPropertyDefault("CXX_INCLUDE_WHAT_YOU_USE", 0);
    this->SetPropertyDefault("CXX_STANDARD", 0);
    this->SetPropertyDefault("CXX_STANDARD_REQUIRED", 0);
    this->SetPropertyDefault("CXX_EXTENSIONS", 0);
    this->SetPropertyDefault("LINK_SEARCH_START_STATIC", 0);
    this->SetPropertyDefault("LINK_SEARCH_END_STATIC", 0);
    }

  // Collect the set of configuration types.
  std::vector<std::string> configNames;
  mf->GetConfigurations(configNames);

  // Setup per-configuration property default values.
  if (this->GetType() != cmState::UTILITY)
    {
    const char* configProps[] = {
      "ARCHIVE_OUTPUT_DIRECTORY_",
      "LIBRARY_OUTPUT_DIRECTORY_",
      "RUNTIME_OUTPUT_DIRECTORY_",
      "PDB_OUTPUT_DIRECTORY_",
      "COMPILE_PDB_OUTPUT_DIRECTORY_",
      "MAP_IMPORTED_CONFIG_",
      0};
    for(std::vector<std::string>::iterator ci = configNames.begin();
        ci != configNames.end(); ++ci)
      {
      std::string configUpper = cmSystemTools::UpperCase(*ci);
      for(const char** p = configProps; *p; ++p)
        {
        if (this->TargetTypeValue == cmState::INTERFACE_LIBRARY
            && strcmp(*p, "MAP_IMPORTED_CONFIG_") != 0)
          {
          continue;
          }
        std::string property = *p;
        property += configUpper;
        this->SetPropertyDefault(property, 0);
        }

      // Initialize per-configuration name postfix property from the
      // variable only for non-executable targets.  This preserves
      // compatibility with previous CMake versions in which executables
      // did not support this variable.  Projects may still specify the
      // property directly.
      if(this->TargetTypeValue != cmState::EXECUTABLE
          && this->TargetTypeValue != cmState::INTERFACE_LIBRARY)
        {
        std::string property = cmSystemTools::UpperCase(*ci);
        property += "_POSTFIX";
        this->SetPropertyDefault(property, 0);
        }
      }
    }

  // Save the backtrace of target construction.
  this->Backtrace = this->Makefile->GetBacktrace();

  if (!this->IsImported())
    {
    // Initialize the INCLUDE_DIRECTORIES property based on the current value
    // of the same directory property:
    const cmStringRange parentIncludes =
        this->Makefile->GetIncludeDirectoriesEntries();
    const cmBacktraceRange parentIncludesBts =
        this->Makefile->GetIncludeDirectoriesBacktraces();

    this->Internal->IncludeDirectoriesEntries.insert(
          this->Internal->IncludeDirectoriesEntries.end(),
          parentIncludes.begin(), parentIncludes.end());
    this->Internal->IncludeDirectoriesBacktraces.insert(
          this->Internal->IncludeDirectoriesBacktraces.end(),
          parentIncludesBts.begin(), parentIncludesBts.end());

    const std::set<std::string> parentSystemIncludes =
                                this->Makefile->GetSystemIncludeDirectories();

    this->SystemIncludeDirectories.insert(parentSystemIncludes.begin(),
                                          parentSystemIncludes.end());

    const cmStringRange parentOptions =
                                this->Makefile->GetCompileOptionsEntries();
    const cmBacktraceRange parentOptionsBts =
                                this->Makefile->GetCompileOptionsBacktraces();

    this->Internal->CompileOptionsEntries.insert(
          this->Internal->CompileOptionsEntries.end(),
          parentOptions.begin(), parentOptions.end());
    this->Internal->CompileOptionsBacktraces.insert(
          this->Internal->CompileOptionsBacktraces.end(),
          parentOptionsBts.begin(), parentOptionsBts.end());
    }

  if (this->GetType() != cmState::INTERFACE_LIBRARY
      && this->GetType() != cmState::UTILITY)
    {
    this->SetPropertyDefault("C_VISIBILITY_PRESET", 0);
    this->SetPropertyDefault("CXX_VISIBILITY_PRESET", 0);
    this->SetPropertyDefault("VISIBILITY_INLINES_HIDDEN", 0);
    }

  if(this->TargetTypeValue == cmState::EXECUTABLE)
    {
    this->SetPropertyDefault("ANDROID_GUI", 0);
    this->SetPropertyDefault("CROSSCOMPILING_EMULATOR", 0);
    this->SetPropertyDefault("ENABLE_EXPORTS", 0);
    }
  if(this->TargetTypeValue == cmState::SHARED_LIBRARY
      || this->TargetTypeValue == cmState::MODULE_LIBRARY)
    {
    this->SetProperty("POSITION_INDEPENDENT_CODE", "True");
    }
  if(this->TargetTypeValue == cmState::SHARED_LIBRARY)
    {
    this->SetPropertyDefault("WINDOWS_EXPORT_ALL_SYMBOLS", 0);
    }

  if (this->GetType() != cmState::INTERFACE_LIBRARY
      && this->GetType() != cmState::UTILITY)
    {
    this->SetPropertyDefault("POSITION_INDEPENDENT_CODE", 0);
    }

  // Record current policies for later use.
  this->Makefile->RecordPolicies(this->PolicyMap);

  if (this->TargetTypeValue == cmState::INTERFACE_LIBRARY)
    {
    // This policy is checked in a few conditions. The properties relevant
    // to the policy are always ignored for cmState::INTERFACE_LIBRARY targets,
    // so ensure that the conditions don't lead to nonsense.
    this->PolicyMap.Set(cmPolicies::CMP0022, cmPolicies::NEW);
    }

  if (this->GetType() != cmState::INTERFACE_LIBRARY
      && this->GetType() != cmState::UTILITY)
    {
    this->SetPropertyDefault("JOB_POOL_COMPILE", 0);
    this->SetPropertyDefault("JOB_POOL_LINK", 0);
    }
}